

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O3

void pp_crypto_hash_sha2_512_process(PHashSHA2_512 *ctx,puint64 *data)

{
  puint64 pVar1;
  puint64 pVar2;
  long lVar3;
  ulong *puVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong auStack_330 [5];
  puint64 local_308 [2];
  ulong local_2f8;
  puint64 pStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  puint64 pStack_2d0;
  ulong auStack_2c8 [11];
  puint64 apStack_270 [5];
  ulong auStack_248 [67];
  
  local_2d8 = ctx->hash[6];
  pStack_2d0 = ctx->hash[7];
  local_2e8 = ctx->hash[4];
  uStack_2e0 = ctx->hash[5];
  local_2f8 = ctx->hash[2];
  pStack_2f0 = ctx->hash[3];
  local_308[0] = ctx->hash[0];
  local_308[1] = ctx->hash[1];
  lVar6 = 0x10;
  puVar4 = auStack_2c8 + 2;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar4 = *data;
    data = data + 1;
    puVar4 = puVar4 + 1;
  }
  do {
    uVar5 = auStack_330[lVar6];
    uVar7 = auStack_2c8[lVar6];
    auStack_2c8[lVar6 + 2] =
         (uVar5 >> 7 ^
         (uVar5 << 0x38 | uVar5 >> 8) ^ (uVar5 >> 1 | (ulong)((uVar5 & 1) != 0) << 0x3f)) +
         auStack_2c8[2] +
         (uVar7 >> 6 ^ (uVar7 << 3 | uVar7 >> 0x3d) ^ (uVar7 << 0x2d | uVar7 >> 0x13)) +
         (&pStack_2f0)[lVar6];
    lVar6 = lVar6 + 1;
    auStack_2c8[2] = uVar5;
  } while (lVar6 != 0x50);
  uVar5 = 0xfffffffffffffff8;
  do {
    lVar3 = ((local_2e8 << 0x17 | local_2e8 >> 0x29) ^
            (local_2e8 << 0x2e | local_2e8 >> 0x12) ^ (local_2e8 << 0x32 | local_2e8 >> 0xe)) +
            pStack_2d0 + pp_crypto_hash_sha2_512_K[uVar5 + 8] + auStack_2c8[uVar5 + 10] +
            ((uStack_2e0 ^ local_2d8) & local_2e8 ^ local_2d8);
    uVar8 = pStack_2f0 + lVar3;
    uVar7 = ((local_308[1] | local_308[0]) & local_2f8 | local_308[1] & local_308[0]) +
            ((local_308[0] << 0x19 | local_308[0] >> 0x27) ^
            (local_308[0] << 0x1e | local_308[0] >> 0x22) ^
            (local_308[0] << 0x24 | local_308[0] >> 0x1c)) + lVar3;
    lVar3 = ((uStack_2e0 ^ local_2e8) & uVar8 ^ uStack_2e0) + local_2d8 +
            pp_crypto_hash_sha2_512_K[uVar5 + 9] +
            ((uVar8 * 0x800000 | uVar8 >> 0x29) ^
            (uVar8 << 0x2e | uVar8 >> 0x12) ^ (uVar8 << 0x32 | uVar8 >> 0xe)) +
            auStack_2c8[uVar5 + 0xb];
    local_2f8 = local_2f8 + lVar3;
    local_2d8 = ((uVar7 | local_308[0]) & local_308[1] | uVar7 & local_308[0]) +
                ((uVar7 * 0x2000000 | uVar7 >> 0x27) ^
                (uVar7 * 0x40000000 | uVar7 >> 0x22) ^ (uVar7 << 0x24 | uVar7 >> 0x1c)) + lVar3;
    lVar3 = uStack_2e0 + pp_crypto_hash_sha2_512_K[uVar5 + 10] + auStack_2c8[uVar5 + 0xc] +
            ((uVar8 ^ local_2e8) & local_2f8 ^ local_2e8) +
            ((local_2f8 * 0x800000 | local_2f8 >> 0x29) ^
            (local_2f8 << 0x2e | local_2f8 >> 0x12) ^ (local_2f8 << 0x32 | local_2f8 >> 0xe));
    local_308[1] = local_308[1] + lVar3;
    uStack_2e0 = lVar3 + ((local_2d8 | uVar7) & local_308[0] | local_2d8 & uVar7) +
                         ((local_2d8 * 0x2000000 | local_2d8 >> 0x27) ^
                         (local_2d8 * 0x40000000 | local_2d8 >> 0x22) ^
                         (local_2d8 << 0x24 | local_2d8 >> 0x1c));
    lVar3 = local_2e8 + pp_crypto_hash_sha2_512_K[uVar5 + 0xb] + auStack_2c8[uVar5 + 0xd] +
            ((local_2f8 ^ uVar8) & local_308[1] ^ uVar8) +
            ((local_308[1] * 0x800000 | local_308[1] >> 0x29) ^
            (local_308[1] << 0x2e | local_308[1] >> 0x12) ^
            (local_308[1] << 0x32 | local_308[1] >> 0xe));
    local_308[0] = local_308[0] + lVar3;
    local_2e8 = lVar3 + ((uStack_2e0 | local_2d8) & uVar7 | uStack_2e0 & local_2d8) +
                        ((uStack_2e0 * 0x2000000 | uStack_2e0 >> 0x27) ^
                        (uStack_2e0 * 0x40000000 | uStack_2e0 >> 0x22) ^
                        (uStack_2e0 << 0x24 | uStack_2e0 >> 0x1c));
    lVar3 = uVar8 + pp_crypto_hash_sha2_512_K[uVar5 + 0xc] + auStack_2c8[uVar5 + 0xe] +
            ((local_308[1] ^ local_2f8) & local_308[0] ^ local_2f8) +
            ((local_308[0] * 0x800000 | local_308[0] >> 0x29) ^
            (local_308[0] << 0x2e | local_308[0] >> 0x12) ^
            (local_308[0] << 0x32 | local_308[0] >> 0xe));
    pStack_2d0 = uVar7 + lVar3;
    pStack_2f0 = ((local_2e8 | uStack_2e0) & local_2d8 | local_2e8 & uStack_2e0) +
                 ((local_2e8 * 0x2000000 | local_2e8 >> 0x27) ^
                 (local_2e8 * 0x40000000 | local_2e8 >> 0x22) ^
                 (local_2e8 << 0x24 | local_2e8 >> 0x1c)) + lVar3;
    lVar3 = local_2f8 + pp_crypto_hash_sha2_512_K[uVar5 + 0xd] + auStack_2c8[uVar5 + 0xf] +
            ((local_308[0] ^ local_308[1]) & pStack_2d0 ^ local_308[1]) +
            ((pStack_2d0 * 0x800000 | pStack_2d0 >> 0x29) ^
            (pStack_2d0 << 0x2e | pStack_2d0 >> 0x12) ^ (pStack_2d0 << 0x32 | pStack_2d0 >> 0xe));
    local_2d8 = local_2d8 + lVar3;
    local_2f8 = ((pStack_2f0 | local_2e8) & uStack_2e0 | pStack_2f0 & local_2e8) +
                ((pStack_2f0 * 0x2000000 | pStack_2f0 >> 0x27) ^
                (pStack_2f0 * 0x40000000 | pStack_2f0 >> 0x22) ^
                (pStack_2f0 << 0x24 | pStack_2f0 >> 0x1c)) + lVar3;
    lVar3 = local_308[1] + pp_crypto_hash_sha2_512_K[uVar5 + 0xe] + auStack_2c8[uVar5 + 0x10] +
            ((pStack_2d0 ^ local_308[0]) & local_2d8 ^ local_308[0]) +
            ((local_2d8 * 0x800000 | local_2d8 >> 0x29) ^
            (local_2d8 << 0x2e | local_2d8 >> 0x12) ^ (local_2d8 << 0x32 | local_2d8 >> 0xe));
    uStack_2e0 = uStack_2e0 + lVar3;
    local_308[1] = ((local_2f8 | pStack_2f0) & local_2e8 | local_2f8 & pStack_2f0) +
                   ((local_2f8 * 0x2000000 | local_2f8 >> 0x27) ^
                   (local_2f8 * 0x40000000 | local_2f8 >> 0x22) ^
                   (local_2f8 << 0x24 | local_2f8 >> 0x1c)) + lVar3;
    lVar3 = local_308[0] + pp_crypto_hash_sha2_512_K[uVar5 + 0xf] + auStack_2c8[uVar5 + 0x11] +
            ((local_2d8 ^ pStack_2d0) & uStack_2e0 ^ pStack_2d0) +
            ((uStack_2e0 * 0x800000 | uStack_2e0 >> 0x29) ^
            (uStack_2e0 << 0x2e | uStack_2e0 >> 0x12) ^ (uStack_2e0 << 0x32 | uStack_2e0 >> 0xe));
    local_2e8 = local_2e8 + lVar3;
    local_308[0] = ((local_308[1] | local_2f8) & pStack_2f0 | local_308[1] & local_2f8) +
                   ((local_308[1] * 0x2000000 | local_308[1] >> 0x27) ^
                   (local_308[1] * 0x40000000 | local_308[1] >> 0x22) ^
                   (local_308[1] << 0x24 | local_308[1] >> 0x1c)) + lVar3;
    uVar5 = uVar5 + 8;
  } while (uVar5 < 0x48);
  lVar3 = 0;
  do {
    pVar1 = (ctx->hash + lVar3)[1];
    pVar2 = local_308[lVar3 + 1];
    ctx->hash[lVar3] = ctx->hash[lVar3] + local_308[lVar3];
    (ctx->hash + lVar3)[1] = pVar1 + pVar2;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 8);
  return;
}

Assistant:

static void
pp_crypto_hash_sha2_512_process (PHashSHA2_512	*ctx,
				 const puint64	data[16])
{
	puint64	tmp_sum1;
	puint64	tmp_sum2;
	puint64 W[80];
	puint64	A[8];
	puint	i;

	for (i = 0; i < 8; ++i)
		A[i] = ctx->hash[i];

	memcpy (W, data, 128);

	for (i = 16; i < 80; ++i)
		W[i] = P_SHA2_512_S1 (W[i -  2]) + W[i -  7] + P_SHA2_512_S0 (W[i - 15]) + W[i - 16];

	for (i = 0; i < 80; i += 8) {
		P_SHA2_512_P (A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i + 0], pp_crypto_hash_sha2_512_K[i + 0])
		P_SHA2_512_P (A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i + 1], pp_crypto_hash_sha2_512_K[i + 1])
		P_SHA2_512_P (A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i + 2], pp_crypto_hash_sha2_512_K[i + 2])
		P_SHA2_512_P (A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i + 3], pp_crypto_hash_sha2_512_K[i + 3])
		P_SHA2_512_P (A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i + 4], pp_crypto_hash_sha2_512_K[i + 4])
		P_SHA2_512_P (A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i + 5], pp_crypto_hash_sha2_512_K[i + 5])
		P_SHA2_512_P (A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i + 6], pp_crypto_hash_sha2_512_K[i + 6])
		P_SHA2_512_P (A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i + 7], pp_crypto_hash_sha2_512_K[i + 7])
	}

	for (i = 0; i < 8; ++i)
		ctx->hash[i] += A[i];
}